

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

void Gia_ManTerStatesFree(Vec_Ptr_t *vStates)

{
  long lVar1;
  
  if (0 < vStates->nSize) {
    lVar1 = 0;
    do {
      if (vStates->pArray[lVar1] != (void *)0x0) {
        free(vStates->pArray[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < vStates->nSize);
  }
  if (vStates->pArray != (void **)0x0) {
    free(vStates->pArray);
    vStates->pArray = (void **)0x0;
  }
  if (vStates != (Vec_Ptr_t *)0x0) {
    free(vStates);
    return;
  }
  return;
}

Assistant:

void Gia_ManTerStatesFree( Vec_Ptr_t * vStates )
{
    unsigned * pTemp;
    int i;
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( vStates );
}